

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
          (dense_hashtable<int,int,TransparentHasher,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,FILE *param_2)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  int bit;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  byte local_39;
  long local_38;
  
  dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_TransparentHasher,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                    ((_IO_FILE *)param_2,0x13578642,4);
  if (((bVar3) &&
      (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                         ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x58),8), bVar3)) &&
     (bVar3 = sparsehash_internal::write_bigendian_number<_IO_FILE,unsigned_long>
                        ((_IO_FILE *)param_2,*(unsigned_long *)(this + 0x50),8), bVar3)) {
    uVar8 = *(ulong *)(this + 0x58);
    if (uVar8 == 0) {
      return true;
    }
    local_38 = 0;
    uVar9 = 0;
    while( true ) {
      iVar6 = *(int *)(this + 0x38);
      lVar5 = 0;
      local_39 = 0;
      do {
        if (lVar5 + uVar9 < uVar8) {
          iVar6 = iVar6 + 1;
          iVar1 = *(int *)(*(long *)(this + 0x70) + local_38 + lVar5 * 4);
          *(int *)(this + 0x38) = iVar6;
          if (*(int *)(this + 0x40) != iVar1) {
            local_39 = local_39 | (byte)(1 << ((byte)lVar5 & 0x1f));
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      sVar4 = fwrite(&local_39,1,1,param_2);
      bVar2 = local_39;
      if (sVar4 != 1) break;
      lVar7 = 0;
      lVar5 = local_38;
      do {
        if (((bVar2 >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
           (sVar4 = fwrite((void *)(*(long *)(this + 0x70) + lVar5),4,1,param_2), sVar4 != 1)) {
          return false;
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 4;
      } while (lVar7 != 8);
      uVar9 = uVar9 + 8;
      uVar8 = *(ulong *)(this + 0x58);
      local_38 = local_38 + 0x20;
      if (uVar8 <= uVar9) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }